

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigWnd.c
# Opt level: O1

Vec_Ptr_t * Saig_ManWindowOutline(Aig_Man_t *p,Aig_Obj_t *pObj,int nDist)

{
  uint uVar1;
  int *pDists;
  Vec_Ptr_t *vNodes;
  void **ppvVar2;
  long lVar3;
  int iVar4;
  ulong uVar5;
  
  pDists = (int *)calloc((long)p->vObjs->nSize,4);
  vNodes = (Vec_Ptr_t *)malloc(0x10);
  vNodes->nCap = 1000;
  vNodes->nSize = 0;
  ppvVar2 = (void **)malloc(8000);
  vNodes->pArray = ppvVar2;
  Aig_ManIncrementTravId(p);
  Saig_ManWindowOutline_rec(p,pObj,nDist,vNodes,pDists);
  if (1 < (long)vNodes->nSize) {
    qsort(vNodes->pArray,(long)vNodes->nSize,8,Aig_ObjCompareIdIncrease);
  }
  if (0 < (long)p->nRegs) {
    uVar1 = p->nTruePos;
    lVar3 = 0;
    do {
      if (((int)uVar1 < 0) || (p->vCos->nSize <= (int)(uVar1 + (int)lVar3))) {
LAB_006f23e0:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      uVar5 = (ulong)(uint)p->nTruePis + lVar3;
      iVar4 = (int)uVar5;
      if ((iVar4 < 0) || (p->vCis->nSize <= iVar4)) goto LAB_006f23e0;
      if ((*(int *)((long)p->vCis->pArray[uVar5 & 0xffffffff] + 0x20) != p->nTravIds) ==
          (*(int *)((long)p->vCos->pArray[(ulong)uVar1 + lVar3] + 0x20) == p->nTravIds)) {
        __assert_fail("Aig_ObjIsTravIdCurrent(p, pObjLi) == Aig_ObjIsTravIdCurrent(p, pObjLo)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saigWnd.c"
                      ,0x71,"Vec_Ptr_t *Saig_ManWindowOutline(Aig_Man_t *, Aig_Obj_t *, int)");
      }
      lVar3 = lVar3 + 1;
    } while (p->nRegs != lVar3);
  }
  if (pDists != (int *)0x0) {
    free(pDists);
  }
  return vNodes;
}

Assistant:

Vec_Ptr_t * Saig_ManWindowOutline( Aig_Man_t * p, Aig_Obj_t * pObj, int nDist )
{
    Vec_Ptr_t * vNodes;
    Aig_Obj_t * pObjLi, * pObjLo;
    int * pDists, i;
    pDists = ABC_CALLOC( int, Aig_ManObjNumMax(p) );
    vNodes = Vec_PtrAlloc( 1000 );
    Aig_ManIncrementTravId( p );
    Saig_ManWindowOutline_rec( p, pObj, nDist, vNodes, pDists );
    Vec_PtrSort( vNodes, (int (*)(void))Aig_ObjCompareIdIncrease );
    // make sure LI/LO are labeled/unlabeled mutually
    Saig_ManForEachLiLo( p, pObjLi, pObjLo, i )
        assert( Aig_ObjIsTravIdCurrent(p, pObjLi) == 
                Aig_ObjIsTravIdCurrent(p, pObjLo) );
    ABC_FREE( pDists );
    return vNodes;
}